

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mydefs.cpp
# Opt level: O2

string * ReplaceString(string *__return_storage_ptr__,string *subject,string *search,string *replace
                      )

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)subject,(ulong)search);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)subject,uVar1,(string *)search->_M_string_length);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)subject);
  return __return_storage_ptr__;
}

Assistant:

std::string ReplaceString(std::string subject, const std::string& search, const std::string& replace) {
  size_t pos = 0;
  while ((pos = subject.find(search, pos)) != std::string::npos) {
    subject.replace(pos, search.length(), replace);
    pos += replace.length();
  }
  return subject;
}